

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O0

DdNode * Cudd_Xeqy(DdManager *dd,int N,DdNode **x,DdNode **y)

{
  DdNode *g;
  DdNode *h;
  int local_4c;
  int i;
  DdNode *w;
  DdNode *v;
  DdNode *u;
  DdNode **y_local;
  DdNode **x_local;
  int N_local;
  DdManager *dd_local;
  
  v = Cudd_bddIte(dd,x[N + -1],y[N + -1],(DdNode *)((ulong)y[N + -1] ^ 1));
  if (v == (DdNode *)0x0) {
    dd_local = (DdManager *)0x0;
  }
  else {
    *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) + 1;
    for (local_4c = N + -2; -1 < local_4c; local_4c = local_4c + -1) {
      g = Cudd_bddAnd(dd,y[local_4c],v);
      if (g == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,v);
        return (DdNode *)0x0;
      }
      *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) + 1;
      h = Cudd_bddAnd(dd,(DdNode *)((ulong)y[local_4c] ^ 1),v);
      if (h == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,v);
        Cudd_RecursiveDeref(dd,g);
        return (DdNode *)0x0;
      }
      *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) + 1;
      Cudd_RecursiveDeref(dd,v);
      v = Cudd_bddIte(dd,x[local_4c],g,h);
      if (v == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,g);
        Cudd_RecursiveDeref(dd,h);
        return (DdNode *)0x0;
      }
      *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) + 1;
      Cudd_RecursiveDeref(dd,g);
      Cudd_RecursiveDeref(dd,h);
    }
    *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)v & 0xfffffffffffffffe) + 4) + -1;
    dd_local = (DdManager *)v;
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_Xeqy(
  DdManager * dd /* DD manager */,
  int  N /* number of x and y variables */,
  DdNode ** x /* array of x variables */,
  DdNode ** y /* array of y variables */)
{
    DdNode *u, *v, *w;
    int     i;

    /* Build bottom part of BDD outside loop. */
    u = Cudd_bddIte(dd, x[N-1], y[N-1], Cudd_Not(y[N-1]));
    if (u == NULL) return(NULL);
    cuddRef(u);

    /* Loop to build the rest of the BDD. */
    for (i = N-2; i >= 0; i--) {
        v = Cudd_bddAnd(dd, y[i], u);
        if (v == NULL) {
            Cudd_RecursiveDeref(dd, u);
            return(NULL);
        }
        cuddRef(v);
        w = Cudd_bddAnd(dd, Cudd_Not(y[i]), u);
        if (w == NULL) {
            Cudd_RecursiveDeref(dd, u);
            Cudd_RecursiveDeref(dd, v);
            return(NULL);
        }
        cuddRef(w);
        Cudd_RecursiveDeref(dd, u);
        u = Cudd_bddIte(dd, x[i], v, w);
        if (u == NULL) {
            Cudd_RecursiveDeref(dd, v);
            Cudd_RecursiveDeref(dd, w);
            return(NULL);
        }
        cuddRef(u);
        Cudd_RecursiveDeref(dd, v);
        Cudd_RecursiveDeref(dd, w);
    }
    cuddDeref(u);
    return(u);

}